

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int iVar1;
  
  iVar1 = glfwGetKey(window,0x100);
  if (iVar1 == 1) {
    glfwSetWindowShouldClose(window,1);
  }
  iVar1 = glfwGetKey(window,0x53);
  if (iVar1 == 1) {
    g_sand_mode = 1;
    g_wall_mode = 0;
    g_eraser_mode = 0;
  }
  iVar1 = glfwGetKey(window,0x57);
  if (iVar1 == 1) {
    g_sand_mode = 0;
    g_wall_mode = 1;
    g_eraser_mode = 0;
  }
  iVar1 = glfwGetKey(window,0x45);
  if (iVar1 == 1) {
    g_sand_mode = 0;
    g_wall_mode = 0;
    g_eraser_mode = 1;
  }
  return;
}

Assistant:

void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods){
    if(glfwGetKey(window, GLFW_KEY_ESCAPE) == GLFW_PRESS)
        glfwSetWindowShouldClose(window, true);

    if(glfwGetKey(window, GLFW_KEY_S) == GLFW_PRESS){
        g_sand_mode = 1;
        g_wall_mode = 0;
        g_eraser_mode = 0;
    }

    if (glfwGetKey(window, GLFW_KEY_W) == GLFW_PRESS){
        g_sand_mode = 0;
        g_wall_mode = 1;
        g_eraser_mode = 0;
    }

    if (glfwGetKey(window, GLFW_KEY_E) == GLFW_PRESS){
        g_sand_mode = 0;
        g_wall_mode = 0;
        g_eraser_mode = 1;
    }
}